

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesMapSemantics_Test::
TestBody(CppMetadataTest_AnnotatesMapSemantics_Test *this)

{
  GeneratedCodeInfo_Annotation *pGVar1;
  void *pvVar2;
  long lVar3;
  pointer ppGVar4;
  int iVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar6;
  pointer ppGVar7;
  GeneratedCodeInfo *in_R8;
  _Alloc_hider _Var8;
  string *in_R9;
  pointer *__ptr;
  initializer_list<int> __l;
  string_view data;
  string_view file_content;
  string_view filename;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  vector<int,_std::allocator<int>_> field_path;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> substring;
  string pb_h;
  GeneratedCodeInfo info;
  FileDescriptorProto file;
  internal iVar9;
  _Alloc_hider message;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> in_stack_fffffffffffffe00;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> __ptr_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e0 [8];
  Message local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_1c8;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  pointer local_1a0;
  undefined1 local_198 [16];
  bool local_188;
  AssertHelper local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  GeneratedCodeInfo local_158;
  undefined1 local_128 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128,(Arena *)0x0);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10),(Arena *)0x0);
  local_178._0_8_ = local_168;
  local_178._8_8_ = (annotation_test_util *)0x0;
  local_168[0] = 0;
  data._M_str = 
  "\n  syntax = \"proto2\";\n  package foo;\n  message Message {\n    map<string, int32> mfield = 1;\n  }\n"
  ;
  data._M_len = 0x60;
  filename._M_str = "test.proto";
  filename._M_len = 10;
  annotation_test_util::AddFile(filename,data);
  _Var8._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffdf8,"test.proto","");
  local_1b0[0] = (internal)
                 CppMetadataTest::CaptureMetadata
                           ((CppMetadataTest *)&stack0xfffffffffffffdf8,(string *)local_128,
                            (FileDescriptorProto *)local_178,(string *)(local_168 + 0x10),in_R8,
                            in_R9,(GeneratedCodeInfo *)_Var8._M_p,
                            (string *)in_stack_fffffffffffffe00._M_head_impl);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p == &local_1f8) {
    if ((bool)local_1b0[0]) goto LAB_00a2f254;
  }
  else {
    operator_delete(_Var8._M_p,local_1f8._M_allocated_capacity + 1);
    if (((byte)local_1b0[0] & 1) != 0) goto LAB_00a2f254;
  }
  testing::Message::Message((Message *)&local_1c8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&stack0xfffffffffffffdf8,(internal *)local_1b0,
             (AssertionResult *)
             "CaptureMetadata(\"test.proto\", &file, &pb_h, &info, nullptr, nullptr, nullptr)",
             "false","true",(char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
             ,0xe1,_Var8._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_198,(Message *)&local_1c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p != &local_1f8) {
    operator_delete(_Var8._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((*local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_Message).super_MessageLite.
              _internal_metadata_.ptr_)();
  }
LAB_00a2f254:
  iVar9 = SUB81(_Var8._M_p,0);
  if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1b0 + 8),local_1a8);
  }
  pVVar6 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_128 + 0x30),0);
  _Var8._M_p = (pointer)((ulong)(pVVar6->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                        );
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&stack0xfffffffffffffdf8,"\"Message\"","file.message_type(0).name()",
             (char (*) [8])0x115bf86,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var8._M_p);
  if (iVar9 == (internal)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (in_stack_fffffffffffffe00._M_head_impl == (GTestFlagSaver *)0x0) {
      _Var8._M_p = anon_var_dwarf_a22956 + 5;
    }
    else {
      _Var8._M_p = *(pointer *)in_stack_fffffffffffffe00._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xe2,_Var8._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((long *)CONCAT71(local_1b0._1_7_,local_1b0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1b0._1_7_,local_1b0[0]) + 8))();
    }
  }
  if (in_stack_fffffffffffffe00._M_head_impl != (GTestFlagSaver *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffe00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe00._M_head_impl);
  }
  __ptr_00._M_head_impl = (GTestFlagSaver *)0x2;
  __l._M_len = 4;
  __l._M_array = (iterator)&stack0xfffffffffffffdf8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1b0,__l,(allocator_type *)&local_1c8);
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message._M_p = (pointer)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffdf8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)&stack0xfffffffffffffdf8,
             (vector<int,_std::allocator<int>_> *)local_1b0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_p != &local_1f8) {
    operator_delete(message._M_p,local_1f8._M_allocated_capacity + 1);
  }
  local_198[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_198._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_198[0]) {
    testing::Message::Message(&local_1d8);
    _Var8._M_p = message._M_p;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xfffffffffffffdf8,(internal *)local_198,
               (AssertionResult *)"!annotations.empty()","false","true",(char *)in_R9);
    message._M_p = _Var8._M_p;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0xe7,_Var8._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message._M_p != &local_1f8) {
      operator_delete(message._M_p,local_1f8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_1d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_1d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_198 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_198._8_8_);
    }
  }
  ppGVar4 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppGVar7 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pGVar1 = *ppGVar7;
      file_content._M_str = (char *)pGVar1;
      file_content._M_len = local_178._0_8_;
      annotation_test_util::GetAnnotationSubstring
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_198,
                 (annotation_test_util *)local_178._8_8_,file_content,(Annotation *)_Var8._M_p);
      local_1d8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = local_188;
      local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_188 == false) {
        testing::Message::Message((Message *)local_1e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&stack0xfffffffffffffdf8,(internal *)&local_1d8,
                   (AssertionResult *)"substring.has_value()","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0xea,message._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)message._M_p != &local_1f8) {
          operator_delete(message._M_p,local_1f8._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) + 8))();
        }
        if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1d0,local_1d0);
        }
        break;
      }
      lVar3 = CONCAT71(local_198._1_7_,local_198[0]);
      if (lVar3 == 0xe) {
        iVar5 = bcmp((void *)local_198._8_8_,"mutable_mfield",0xe);
        if (iVar5 == 0) {
          local_1d8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 2;
          local_1e0._0_4_ = (pGVar1->field_0)._impl_.semantic_;
          _Var8._M_p = (pointer)local_1e0;
          testing::internal::
          CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                    ((internal *)&stack0xfffffffffffffdf8,
                     "GeneratedCodeInfo_Annotation_Semantic_ALIAS","annotation->semantic()",
                     (GeneratedCodeInfo_Annotation_Semantic *)&local_1d8,
                     (GeneratedCodeInfo_Annotation_Semantic *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1e0)->_M_allocated_capacity);
          if (SUB81(message._M_p,0) == (internal)0x0) {
            testing::Message::Message(&local_1d8);
            _Var8._M_p = anon_var_dwarf_a22956 + 5;
            if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 )__ptr_00._M_head_impl !=
                (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 )0x0) {
              _Var8._M_p = *(pointer *)__ptr_00._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1e0)->_M_allocated_capacity,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                       ,0xf3,_Var8._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1e0)->_M_allocated_capacity,&local_1d8);
            goto LAB_00a2f687;
          }
          goto LAB_00a2f69f;
        }
      }
      else if (lVar3 == 0xc) {
        iVar5 = bcmp((void *)local_198._8_8_,"clear_mfield",0xc);
        if (iVar5 == 0) {
          local_1d8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 1;
          local_1e0._0_4_ = (pGVar1->field_0)._impl_.semantic_;
          _Var8._M_p = (pointer)local_1e0;
          testing::internal::
          CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                    ((internal *)&stack0xfffffffffffffdf8,
                     "GeneratedCodeInfo_Annotation_Semantic_SET","annotation->semantic()",
                     (GeneratedCodeInfo_Annotation_Semantic *)&local_1d8,
                     (GeneratedCodeInfo_Annotation_Semantic *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1e0)->_M_allocated_capacity);
          if (SUB81(message._M_p,0) == (internal)0x0) {
            testing::Message::Message(&local_1d8);
            _Var8._M_p = anon_var_dwarf_a22956 + 5;
            if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 )__ptr_00._M_head_impl !=
                (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 )0x0) {
              _Var8._M_p = *(pointer *)__ptr_00._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1e0)->_M_allocated_capacity,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                       ,0xf0,_Var8._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1e0)->_M_allocated_capacity,&local_1d8);
            goto LAB_00a2f687;
          }
          goto LAB_00a2f69f;
        }
      }
      else if ((lVar3 == 6) &&
              ((short)*(int *)(local_198._8_8_ + 4) == 0x646c &&
               *(int *)local_198._8_8_ == 0x6569666d)) {
        local_1d8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        local_1e0._0_4_ = (pGVar1->field_0)._impl_.semantic_;
        _Var8._M_p = (pointer)local_1e0;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)&stack0xfffffffffffffdf8,"GeneratedCodeInfo_Annotation_Semantic_NONE"
                   ,"annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)&local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1e0)->_M_allocated_capacity);
        if (SUB81(message._M_p,0) == (internal)0x0) {
          testing::Message::Message(&local_1d8);
          _Var8._M_p = anon_var_dwarf_a22956 + 5;
          if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )__ptr_00._M_head_impl !=
              (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )0x0) {
            _Var8._M_p = *(pointer *)__ptr_00._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1e0)->_M_allocated_capacity,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0xed,_Var8._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1e0)->_M_allocated_capacity,&local_1d8);
LAB_00a2f687:
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1e0)->_M_allocated_capacity);
          if ((long *)CONCAT44(local_1d8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               local_1d8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1d8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           local_1d8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._0_4_) + 8))();
          }
        }
LAB_00a2f69f:
        if (__ptr_00._M_head_impl != (GTestFlagSaver *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xfffffffffffffe00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __ptr_00._M_head_impl);
        }
      }
      ppGVar7 = ppGVar7 + 1;
    } while (ppGVar7 != ppGVar4);
  }
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT71(local_1b0._1_7_,local_1b0[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_1a0 - (long)pvVar2);
  }
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesMapSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kMapFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "clear_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}